

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool redit_show(CHAR_DATA *ch,char *argument)

{
  long *plVar1;
  char cVar2;
  short sVar3;
  ROOM_INDEX_DATA *pRVar4;
  TRAP_DATA *pTVar5;
  EXIT_DATA *pEVar6;
  bool bVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  char cVar11;
  long lVar12;
  EXTRA_DESCR_DATA *ed;
  EXTRA_DESCR_DATA *pEVar13;
  CHAR_DATA *pCVar14;
  OBJ_DATA *pOVar15;
  basic_string_view<char> format;
  basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  char buf1 [9216];
  char buf [4608];
  char word [4608];
  char reset_state [4608];
  long *local_5a78 [2];
  long local_5a68 [2];
  char local_5a58 [12];
  char cStack_5a4c;
  undefined8 auStack_5a4b [1150];
  char local_3658 [4608];
  buffer<char> local_2458;
  char local_2438 [4576];
  char *local_1258 [2];
  ulong local_1248;
  ulong local_1238;
  ulong local_1228;
  char *local_1218;
  char *local_1208;
  
  pRVar4 = ch->in_room;
  local_5a58[0] = '\0';
  sprintf(local_3658,"Description:\n\r%s",pRVar4->description);
  strcat(local_5a58,local_3658);
  if (pRVar4->alt_description == (char *)0x0) {
    sVar9 = strlen(local_5a58);
    *(undefined8 *)((long)auStack_5a4b + sVar9) = 0xd0a5d656e6f4e;
    builtin_strncpy(local_5a58 + sVar9,"Alt Desc:   ",0xc);
    builtin_strncpy(&cStack_5a4c + sVar9,"[Non",4);
  }
  else {
    sprintf(local_3658,"Alt Desc:\n\r%sAlternate Room Title is %s.\n\rDescription is %s.\n\r",
            pRVar4->alt_description,pRVar4->alt_name,
            altdesc_condtable[pRVar4->alt_description_cond].display);
    strcat(local_5a58,local_3658);
  }
  sprintf(local_3658,"Name:       [%s]\n\rArea:       [%5d] %s\n\r",pRVar4->name,
          (ulong)(uint)pRVar4->area->vnum,pRVar4->area->name);
  strcat(local_5a58,local_3658);
  sVar3 = pRVar4->vnum;
  pcVar8 = flag_string_old(sector_flags,(int)pRVar4->sector_type);
  sprintf(local_3658,"Vnum:       [%5d]\n\rSector:     [%s]\n\r",(ulong)(uint)(int)sVar3,pcVar8);
  strcat(local_5a58,local_3658);
  sprintf(local_3658,"Cabal:      [%s]\n\r",cabal_table[pRVar4->cabal].name);
  strcat(local_5a58,local_3658);
  pcVar8 = pRVar4->owner;
  if (pcVar8 == (char *)0x0) {
    pcVar8 = "None";
  }
  sprintf(local_3658,"Owner:      [%s]\n\r",pcVar8);
  strcat(local_5a58,local_3658);
  pcVar8 = flag_string(room_flags,pRVar4->room_flags);
  sprintf(local_3658,"Room flags: [%s]\n\r",pcVar8);
  strcat(local_5a58,local_3658);
  sprintf(local_3658,"Health recovery:[%d]\n\rMana recovery  :[%d]\n\r",
          (ulong)(uint)(int)pRVar4->heal_rate,(ulong)(uint)(int)pRVar4->mana_rate);
  strcat(local_5a58,local_3658);
  sVar9 = strlen(local_5a58);
  builtin_strncpy(local_5a58 + sVar9,"Trap:",6);
  if (pRVar4->trap == (TRAP_DATA *)0x0) {
    sVar9 = strlen(local_5a58);
    builtin_strncpy(local_5a58 + sVar9,"       [None]\n\r",0x10);
  }
  else {
    local_1258[0] = flag_name_lookup((long)pRVar4->trap->type,trap_table);
    pTVar5 = pRVar4->trap;
    local_1218 = pTVar5->trig_echo;
    local_1208 = pTVar5->exec_echo;
    if (local_1218 == (char *)0x0) {
      local_1218 = "None";
    }
    if (local_1208 == (char *)0x0) {
      local_1208 = "None";
    }
    local_1248 = (ulong)(uint)pTVar5->quality;
    local_1238 = (ulong)(uint)pTVar5->complexity;
    local_1228 = (ulong)(uint)pTVar5->timer;
    local_2458.size_ = 0;
    local_2458._vptr_buffer = (_func_int **)&PTR_grow_00457340;
    local_2458.capacity_ = 500;
    format.size_ = 0x90;
    format.data_ = 
    "\n\r Type:          [%s]\n\r Quality:       [%2d]\n\r Complexity:    [%3d]\n\r Timer:         [%d seconds]\n\r Trigger Echo:  [%s]\n\r Execute Echo:  [%s]\n\r"
    ;
    args.field_1.values_ =
         (value<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *)local_1258;
    args.desc_ = 0xcc111c;
    local_2458.ptr_ = local_2438;
    fmt::v9::detail::vprintf<char,fmt::v9::basic_printf_context<fmt::v9::appender,char>>
              (&local_2458,format,args);
    local_5a78[0] = local_5a68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_5a78,local_2458.ptr_,local_2458.ptr_ + local_2458.size_);
    if (local_2458.ptr_ != local_2438) {
      operator_delete(local_2458.ptr_,local_2458.capacity_);
    }
    plVar1 = local_5a78[0];
    strcat(local_5a58,(char *)local_5a78[0]);
    if (plVar1 != local_5a68) {
      operator_delete(plVar1,local_5a68[0] + 1);
    }
  }
  send_to_char(local_5a58,ch);
  local_5a58[0] = '\0';
  plVar1 = pRVar4->progtypes;
  bVar7 = IS_ZERO_VECTOR(plVar1);
  if (!bVar7) {
    send_to_char("Room Programs:\n\r",ch);
    if ((*plVar1 & 1) != 0) {
      sprintf(local_3658," [pulse_prog] %s\n\r",pRVar4->rprogs->pulse_name);
      send_to_char(local_3658,ch);
    }
    if ((*plVar1 & 2) != 0) {
      sprintf(local_3658," [entry_prog] %s\n\r",pRVar4->rprogs->entry_name);
      send_to_char(local_3658,ch);
    }
    if ((*plVar1 & 4) != 0) {
      sprintf(local_3658," [move_prog] %s\n\r",pRVar4->rprogs->move_name);
      send_to_char(local_3658,ch);
    }
    if ((*plVar1 & 8) != 0) {
      sprintf(local_3658," [drop_prog] %s\n\r",pRVar4->rprogs->drop_name);
      send_to_char(local_3658,ch);
    }
    if ((*plVar1 & 0x10) != 0) {
      sprintf(local_3658," [speech_prog] %s\n\r",pRVar4->rprogs->speech_name);
      send_to_char(local_3658,ch);
    }
    if ((*plVar1 & 0x20) != 0) {
      sprintf(local_3658," [open_prog] %s\n\r",pRVar4->rprogs->open_name);
      send_to_char(local_3658,ch);
    }
  }
  sVar9 = strlen(local_5a58);
  builtin_strncpy(local_5a58 + sVar9,"Characters: [",0xe);
  pCVar14 = pRVar4->people;
  if (pCVar14 == (CHAR_DATA *)0x0) {
    sVar9 = strlen(local_5a58);
    builtin_strncpy(local_5a58 + sVar9,"none]\n\r",8);
  }
  else {
    do {
      one_argument(pCVar14->name,local_3658);
      strcat(local_5a58,local_3658);
      sVar9 = strlen(local_5a58);
      (local_5a58 + sVar9)[0] = ' ';
      (local_5a58 + sVar9)[1] = '\0';
      pCVar14 = pCVar14->next_in_room;
    } while (pCVar14 != (CHAR_DATA *)0x0);
    sVar9 = strlen(local_5a58);
    local_5a58[(long)((sVar9 << 0x20) + -0x100000000) >> 0x20] = ']';
    sVar9 = strlen(local_5a58);
    (local_5a58 + sVar9)[0] = '\n';
    (local_5a58 + sVar9)[1] = '\r';
    local_5a58[sVar9 + 2] = '\0';
  }
  sVar9 = strlen(local_5a58);
  builtin_strncpy(local_5a58 + sVar9,"Objects:    [",0xe);
  pOVar15 = pRVar4->contents;
  if (pOVar15 == (OBJ_DATA *)0x0) {
    sVar9 = strlen(local_5a58);
    builtin_strncpy(local_5a58 + sVar9,"none]\n\r",8);
  }
  else {
    do {
      one_argument(pOVar15->name,local_3658);
      strcat(local_5a58,local_3658);
      sVar9 = strlen(local_5a58);
      (local_5a58 + sVar9)[0] = ' ';
      (local_5a58 + sVar9)[1] = '\0';
      pOVar15 = pOVar15->next_content;
    } while (pOVar15 != (OBJ_DATA *)0x0);
    sVar9 = strlen(local_5a58);
    local_5a58[(long)((sVar9 << 0x20) + -0x100000000) >> 0x20] = ']';
    sVar9 = strlen(local_5a58);
    (local_5a58 + sVar9)[0] = '\n';
    (local_5a58 + sVar9)[1] = '\r';
    local_5a58[sVar9 + 2] = '\0';
  }
  pEVar13 = pRVar4->extra_descr;
  if (pEVar13 != (EXTRA_DESCR_DATA *)0x0) {
    do {
      sVar9 = strlen(local_5a58);
      *(undefined8 *)((long)auStack_5a4b + sVar9) = 0x203a64726f7779;
      builtin_strncpy(local_5a58 + sVar9,"Extra Desc Keywo",0x10);
      strcat(local_5a58,pEVar13->keyword);
      sVar9 = strlen(local_5a58);
      (local_5a58 + sVar9)[0] = '\n';
      (local_5a58 + sVar9)[1] = '\r';
      local_5a58[sVar9 + 2] = '\0';
      pEVar13 = pEVar13->next;
    } while (pEVar13 != (EXTRA_DESCR_DATA *)0x0);
  }
  lVar12 = 0;
  do {
    pEVar6 = pRVar4->exit[lVar12];
    if (pEVar6 != (EXIT_DATA *)0x0) {
      pcVar8 = capitalize(dir_name[lVar12]);
      if ((pEVar6->u1).to_room == (ROOM_INDEX_DATA *)0x0) {
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)(uint)(int)((pEVar6->u1).to_room)->vnum;
      }
      sprintf(local_3658,"-%-5s to [%5d] Key: [%5d] ",pcVar8,uVar10,(ulong)(uint)(int)pEVar6->key);
      strcat(local_5a58,local_3658);
      pcVar8 = flag_string(exit_flags,pEVar6->exit_info);
      sVar9 = strlen(local_5a58);
      builtin_strncpy(local_5a58 + sVar9," Exit flags: [",0xf);
      pcVar8 = one_argument(pcVar8,(char *)&local_2458);
      while ((char)local_2458._vptr_buffer != '\0') {
        bVar7 = str_infix((char *)&local_2458,(char *)local_1258);
        if (bVar7) {
          sVar9 = strlen((char *)&local_2458);
          if (0 < (int)(uint)sVar9) {
            uVar10 = 0;
            do {
              cVar2 = *(char *)((long)&local_2458._vptr_buffer + uVar10);
              cVar11 = cVar2 + -0x20;
              if (0x19 < (byte)(cVar2 + 0x9fU)) {
                cVar11 = cVar2;
              }
              *(char *)((long)&local_2458._vptr_buffer + uVar10) = cVar11;
              uVar10 = uVar10 + 1;
            } while (((uint)sVar9 & 0x7fffffff) != uVar10);
          }
        }
        strcat(local_5a58,(char *)&local_2458);
        sVar9 = strlen(local_5a58);
        (local_5a58 + sVar9)[0] = ' ';
        (local_5a58 + sVar9)[1] = '\0';
        pcVar8 = one_argument(pcVar8,(char *)&local_2458);
      }
      sVar9 = strlen(local_5a58);
      local_5a58[(long)((sVar9 << 0x20) + -0x100000000) >> 0x20] = ']';
      sVar9 = strlen(local_5a58);
      (local_5a58 + sVar9)[0] = '\n';
      (local_5a58 + sVar9)[1] = '\r';
      local_5a58[sVar9 + 2] = '\0';
      if ((pEVar6->keyword != (char *)0x0) && (*pEVar6->keyword != '\0')) {
        sprintf(local_3658,"Kwds: [%s]\n\r");
        strcat(local_5a58,local_3658);
      }
      pcVar8 = pEVar6->description;
      if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
        strcpy(local_3658,pcVar8);
        strcat(local_5a58,local_3658);
      }
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 6);
  send_to_char(local_5a58,ch);
  send_to_char("Syntax:  resets\n\r---- RESETS ----\n\r",ch);
  do_resets(ch,"");
  return false;
}

Assistant:

bool redit_show(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *pRoom;
	char buf[MAX_STRING_LENGTH];
	char buf1[2 * MAX_STRING_LENGTH];
	OBJ_DATA *obj;
	CHAR_DATA *rch;
	int door;
	bool fcnt;

	EDIT_ROOM(ch, pRoom);

	buf1[0] = '\0';

	sprintf(buf, "Description:\n\r%s", pRoom->description);
	strcat(buf1, buf);

	if (pRoom->alt_description)
	{
		sprintf(buf, "Alt Desc:\n\r%sAlternate Room Title is %s.\n\rDescription is %s.\n\r",
			pRoom->alt_description,
			pRoom->alt_name,
			altdesc_condtable[pRoom->alt_description_cond].display);
		strcat(buf1, buf);
	}
	else
		strcat(buf1, "Alt Desc:   [None]\n\r");

	sprintf(buf, "Name:       [%s]\n\rArea:       [%5d] %s\n\r",
		pRoom->name,
		pRoom->area->vnum,
		pRoom->area->name);
	strcat(buf1, buf);

	sprintf(buf, "Vnum:       [%5d]\n\rSector:     [%s]\n\r",
		pRoom->vnum,
		flag_string_old(sector_flags, pRoom->sector_type));
	strcat(buf1, buf);

	sprintf(buf, "Cabal:      [%s]\n\r", cabal_table[pRoom->cabal].name);
	strcat(buf1, buf);

	sprintf(buf, "Owner:      [%s]\n\r", (pRoom->owner) ? pRoom->owner : "None");
	strcat(buf1, buf);

	sprintf(buf, "Room flags: [%s]\n\r", flag_string(room_flags, pRoom->room_flags));
	strcat(buf1, buf);

	sprintf(buf, "Health recovery:[%d]\n\rMana recovery  :[%d]\n\r", pRoom->heal_rate, pRoom->mana_rate);
	strcat(buf1, buf);

	strcat(buf1, "Trap:");

	if (pRoom->trap)
	{
		auto buffer = 
			fmt::sprintf("\n\r Type:          [%s]\n\r Quality:       [%2d]\n\r Complexity:    [%3d]\n\r Timer:         [%d seconds]\n\r Trigger Echo:  [%s]\n\r Execute Echo:  [%s]\n\r",
				flag_name_lookup(pRoom->trap->type, trap_table),
				pRoom->trap->quality,
				pRoom->trap->complexity,
				pRoom->trap->timer,
				(pRoom->trap->trig_echo != nullptr) ? pRoom->trap->trig_echo : "None",
				(pRoom->trap->exec_echo != nullptr) ? pRoom->trap->exec_echo : "None"); //TODO: change the rest of the sprintf calls to format

		strcat(buf1, buffer.data());
	}
	else
	{
		strcat(buf1, "       [None]\n\r");
	}

	send_to_char(buf1, ch);
	buf1[0] = '\0';

	if (!IS_ZERO_VECTOR(pRoom->progtypes))
	{
		send_to_char("Room Programs:\n\r", ch);
		if (IS_SET(pRoom->progtypes, RPROG_PULSE))
		{
			sprintf(buf, " [pulse_prog] %s\n\r", pRoom->rprogs->pulse_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_ENTRY))
		{
			sprintf(buf, " [entry_prog] %s\n\r", pRoom->rprogs->entry_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_MOVE))
		{
			sprintf(buf, " [move_prog] %s\n\r", pRoom->rprogs->move_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_DROP))
		{
			sprintf(buf, " [drop_prog] %s\n\r", pRoom->rprogs->drop_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_SPEECH))
		{
			sprintf(buf, " [speech_prog] %s\n\r", pRoom->rprogs->speech_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(pRoom->progtypes, RPROG_OPEN))
		{
			sprintf(buf, " [open_prog] %s\n\r", pRoom->rprogs->open_name);
			send_to_char(buf, ch);
		}
	}

	strcat(buf1, "Characters: [");
	fcnt = false;

	for (rch = pRoom->people; rch; rch = rch->next_in_room)
	{
		one_argument(rch->name, buf);
		strcat(buf1, buf);
		strcat(buf1, " ");
		fcnt = true;
	}

	if (fcnt)
	{
		int end = strlen(buf1) - 1;
		buf1[end] = ']';
		strcat(buf1, "\n\r");
	}
	else
	{
		strcat(buf1, "none]\n\r");
	}

	strcat(buf1, "Objects:    [");
	fcnt = false;

	for (obj = pRoom->contents; obj; obj = obj->next_content)
	{
		one_argument(obj->name, buf);
		strcat(buf1, buf);
		strcat(buf1, " ");
		fcnt = true;
	}

	if (fcnt)
	{
		int end = strlen(buf1) - 1;
		buf1[end] = ']';
		strcat(buf1, "\n\r");
	}
	else
	{
		strcat(buf1, "none]\n\r");
	}

	if (pRoom->extra_descr)
	{
		for (EXTRA_DESCR_DATA *ed = pRoom->extra_descr; ed; ed = ed->next)
		{
			strcat(buf1, "Extra Desc Keyword: ");
			strcat(buf1, ed->keyword);
			strcat(buf1, "\n\r");
		}
	}

	for (door = 0; door < MAX_DIR; door++)
	{
		EXIT_DATA *pexit = pRoom->exit[door];

		if (pexit != nullptr)
		{
			char word[MAX_INPUT_LENGTH];
			char reset_state[MAX_STRING_LENGTH];
			char *state;
			int i, length;

			sprintf(buf, "-%-5s to [%5d] Key: [%5d] ",
				capitalize(dir_name[door]),
				pexit->u1.to_room ? pexit->u1.to_room->vnum : 0, /* ROM OLC */
				pexit->key);
			strcat(buf1, buf);

			/*
			 * Format up the exit info.
			 * Capitalize all flags that are not part of the reset info.
			 */
			state = flag_string(exit_flags, pexit->exit_info);
			strcat(buf1, " Exit flags: [");

			for (;;)
			{
				state = one_argument(state, word);

				if (word[0] == '\0')
				{
					int end = strlen(buf1) - 1;
					buf1[end] = ']';
					strcat(buf1, "\n\r");
					break;
				}

				if (str_infix(word, reset_state))
				{
					length = strlen(word);

					for (i = 0; i < length; i++)
					{
						word[i] = UPPER(word[i]);
					}
				}

				strcat(buf1, word);
				strcat(buf1, " ");
			}

			if (pexit->keyword && pexit->keyword[0] != '\0')
			{
				sprintf(buf, "Kwds: [%s]\n\r", pexit->keyword);
				strcat(buf1, buf);
			}

			if (pexit->description && pexit->description[0] != '\0')
			{
				sprintf(buf, "%s", pexit->description);
				strcat(buf1, buf);
			}
		}
	}

	send_to_char(buf1, ch);
	send_to_char("Syntax:  resets\n\r---- RESETS ----\n\r", ch);
	do_resets(ch, "");
	return false;
}